

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O0

bool iDynTree::exportInertial(SpatialInertia *inertia,xmlNodePtr parent_element)

{
  bool bVar1;
  undefined8 uVar2;
  string *psVar3;
  undefined8 uVar4;
  undefined8 in_RSI;
  RotationalInertia rotInertia;
  xmlNodePtr inertia_xml;
  xmlNodePtr mass_xml;
  xmlNodePtr inertial;
  string bufStr;
  bool ok;
  size_t in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  MatrixFixSize<3U,_3U> *in_stack_fffffffffffffda0;
  bool local_251;
  string *in_stack_fffffffffffffdb0;
  string *outStr;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  bool local_231;
  bool local_211;
  bool local_1f1;
  bool local_1d1;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  Transform *in_stack_fffffffffffffe40;
  bool local_1b1;
  bool local_1a1;
  bool local_181;
  Position local_120 [24];
  Rotation local_108 [72];
  Transform local_c0 [96];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_40;
  string local_38 [39];
  bool local_11;
  undefined8 local_10;
  
  local_11 = true;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_38);
  local_40 = xmlNewChild(local_10,0,"inertial");
  local_58 = xmlNewChild(local_40,0,"mass");
  local_181 = false;
  if ((local_11 & 1U) != 0) {
    local_60 = iDynTree::SpatialInertia::getMass();
    local_181 = doubleToStringWithClassicLocale
                          ((double *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                           in_stack_fffffffffffffdb0);
  }
  uVar4 = local_58;
  local_11 = local_181;
  uVar2 = std::__cxx11::string::c_str();
  xmlNewProp(uVar4,"value",uVar2);
  local_1a1 = false;
  if ((local_11 & 1U) != 0) {
    iDynTree::Rotation::Identity();
    iDynTree::SpatialInertia::getCenterOfMass();
    iDynTree::Transform::Transform(local_c0,local_108,local_120);
    local_1a1 = exportTransform(in_stack_fffffffffffffe40,
                                (xmlNodePtr)
                                CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  }
  local_11 = local_1a1;
  psVar3 = (string *)xmlNewChild(local_40,0,"inertia");
  iDynTree::SpatialInertia::getRotationalInertiaWrtCenterOfMass();
  local_1b1 = false;
  if ((local_11 & 1U) != 0) {
    MatrixFixSize<3U,_3U>::operator()
              (in_stack_fffffffffffffda0,
               CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd90);
    local_1b1 = doubleToStringWithClassicLocale
                          ((double *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                           in_stack_fffffffffffffdb0);
  }
  local_11 = local_1b1;
  uVar4 = std::__cxx11::string::c_str();
  xmlNewProp(psVar3,"ixx",uVar4);
  local_1d1 = false;
  if ((local_11 & 1U) != 0) {
    MatrixFixSize<3U,_3U>::operator()
              (in_stack_fffffffffffffda0,
               CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd90);
    local_1d1 = doubleToStringWithClassicLocale
                          ((double *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                           in_stack_fffffffffffffdb0);
  }
  local_11 = local_1d1;
  uVar4 = std::__cxx11::string::c_str();
  xmlNewProp(psVar3,"ixy",uVar4);
  local_1f1 = false;
  if ((local_11 & 1U) != 0) {
    MatrixFixSize<3U,_3U>::operator()
              (in_stack_fffffffffffffda0,
               CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd90);
    local_1f1 = doubleToStringWithClassicLocale
                          ((double *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                           in_stack_fffffffffffffdb0);
  }
  local_11 = local_1f1;
  uVar4 = std::__cxx11::string::c_str();
  xmlNewProp(psVar3,"ixz",uVar4);
  local_211 = false;
  if ((local_11 & 1U) != 0) {
    MatrixFixSize<3U,_3U>::operator()
              (in_stack_fffffffffffffda0,
               CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd90);
    local_211 = doubleToStringWithClassicLocale
                          ((double *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                           in_stack_fffffffffffffdb0);
  }
  local_11 = local_211;
  uVar4 = std::__cxx11::string::c_str();
  xmlNewProp(psVar3,"iyy",uVar4);
  local_231 = false;
  if ((local_11 & 1U) != 0) {
    MatrixFixSize<3U,_3U>::operator()
              (in_stack_fffffffffffffda0,
               CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd90);
    in_stack_fffffffffffffdbf =
         doubleToStringWithClassicLocale
                   ((double *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                    in_stack_fffffffffffffdb0);
    local_231 = (bool)in_stack_fffffffffffffdbf;
  }
  local_11 = local_231;
  outStr = psVar3;
  uVar4 = std::__cxx11::string::c_str();
  xmlNewProp(outStr,"iyz",uVar4);
  local_251 = false;
  if ((local_11 & 1U) != 0) {
    MatrixFixSize<3U,_3U>::operator()
              (in_stack_fffffffffffffda0,
               CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd90);
    local_251 = doubleToStringWithClassicLocale
                          ((double *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                           outStr);
  }
  local_11 = local_251;
  uVar4 = std::__cxx11::string::c_str();
  xmlNewProp(psVar3,"izz",uVar4);
  bVar1 = local_11;
  std::__cxx11::string::~string(local_38);
  return (bool)(bVar1 & 1);
}

Assistant:

bool exportInertial(const SpatialInertia &inertia, xmlNodePtr parent_element)
{
    bool ok=true;
    std::string bufStr;
    xmlNodePtr inertial = xmlNewChild(parent_element, NULL, BAD_CAST "inertial", NULL);


    xmlNodePtr mass_xml = xmlNewChild(inertial, NULL, BAD_CAST "mass", NULL);
    ok = ok && doubleToStringWithClassicLocale(inertia.getMass(), bufStr);
    xmlNewProp(mass_xml, BAD_CAST "value", BAD_CAST bufStr.c_str());

    ok = ok && exportTransform(Transform(Rotation::Identity(), inertia.getCenterOfMass()), inertial);

    xmlNodePtr inertia_xml = xmlNewChild(inertial, NULL, BAD_CAST "inertia", NULL);
    RotationalInertia rotInertia = inertia.getRotationalInertiaWrtCenterOfMass();
    ok = ok && doubleToStringWithClassicLocale(rotInertia(0, 0), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "ixx", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(0, 1), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "ixy", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(0, 2), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "ixz", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(1, 1), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "iyy", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(1, 2), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "iyz", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(2, 2), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "izz", BAD_CAST bufStr.c_str());

    return ok;
}